

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Assign<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>>
               (ArgMinMaxState<duckdb::string_t,_int> *state,string_t *x,int *y,bool x_null)

{
  string_t new_value;
  byte in_CL;
  int *in_RDX;
  string_t *in_RSI;
  long in_RDI;
  undefined8 unaff_retaddr;
  
  *(byte *)(in_RDI + 1) = in_CL & 1;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    new_value.value.pointer.ptr = (char *)unaff_retaddr;
    new_value.value._0_8_ = in_RDI;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>(in_RSI,new_value);
  }
  ArgMinMaxStateBase::AssignValue<int>((int *)(in_RDI + 0x18),*in_RDX);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}